

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall
smf::MidiMessage::makeTemperamentMeantone
          (MidiMessage *this,double fraction,int referencePitchClass,int channelMask)

{
  double dVar1;
  pointer pdVar2;
  value_type_conflict3 *__val;
  vector<double,_std::allocator<double>_> temperament;
  vector<double,_std::allocator<double>_> local_48;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar2 = (pointer)operator_new(0x60);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar2 + 0xc;
  *pdVar2 = 0.0;
  pdVar2[1] = 0.0;
  pdVar2[2] = 0.0;
  pdVar2[3] = 0.0;
  pdVar2[4] = 0.0;
  pdVar2[5] = 0.0;
  pdVar2[6] = 0.0;
  pdVar2[7] = 0.0;
  pdVar2[8] = 0.0;
  pdVar2[9] = 0.0;
  pdVar2[10] = 0.0;
  pdVar2[0xb] = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar2;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  dVar1 = pow(1.0125,-fraction);
  dVar1 = log2(dVar1 * 1.5);
  dVar1 = dVar1 * 1200.0;
  pdVar2[1] = dVar1 * -5.0 + 3500.0;
  pdVar2[8] = dVar1 * -4.0 + 2800.0;
  pdVar2[3] = dVar1 * -3.0 + 2100.0;
  pdVar2[10] = 1400.0 - (dVar1 + dVar1);
  pdVar2[5] = 700.0 - dVar1;
  *pdVar2 = 0.0;
  pdVar2[7] = dVar1 + -700.0;
  pdVar2[2] = dVar1 + dVar1 + -1400.0;
  pdVar2[9] = dVar1 * 3.0 + -2100.0;
  pdVar2[4] = dVar1 * 4.0 + -2800.0;
  pdVar2[0xb] = dVar1 * 5.0 + -3500.0;
  pdVar2[6] = dVar1 * 6.0 + -4200.0;
  makeMts9_TemperamentByCentsDeviationFromET(this,&local_48,referencePitchClass,channelMask);
  operator_delete(pdVar2);
  return;
}

Assistant:

void MidiMessage::makeTemperamentMeantone(double fraction, int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12);
	double x = 1200.0 * log2((3.0/2.0)*pow(81.0/80.0, -fraction));
	temperament[1]  = x * -5 + 3500; //  17.107 cents (for fraction = 0.25)
	temperament[8]  = x * -4 + 2800; //  13.686 cents (for fraction = 0.25)
	temperament[3]  = x * -3 + 2100; //  10.265 cents (for fraction = 0.25)
	temperament[10] = x * -2 + 1400; //   6.843 cents (for fraction = 0.25)
	temperament[5]  = x * -1 + 700;  //   3.422 cents (for fraction = 0.25)
	temperament[0]  = 0.0;           //   0     cents
	temperament[7]  = x *  1 - 700;  //  -3.422 cents (for fraction = 0.25)
	temperament[2]  = x *  2 - 1400; //  -6.843 cents (for fraction = 0.25)
	temperament[9]  = x *  3 - 2100; // -10.265 cents (for fraction = 0.25)
	temperament[4]  = x *  4 - 2800; // -13.686 cents (for fraction = 0.25)
	temperament[11] = x *  5 - 3500; // -17.107 cents (for fraction = 0.25)
	temperament[6]  = x *  6 - 4200; // -20.529 cents (for fraction = 0.25)
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}